

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

void close_socket(uv_os_sock_t sock)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = close(sock);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x68) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
              ,0x8d,"r == 0 || errno == ECONNRESET");
      abort();
    }
  }
  return;
}

Assistant:

static void close_socket(uv_os_sock_t sock) {
  int r;
#ifdef _WIN32
  r = closesocket(sock);
#else
  r = close(sock);
#endif
  /* On FreeBSD close() can fail with ECONNRESET if the socket was shutdown by
   * the peer before all pending data was delivered.
   */
  ASSERT(r == 0 || errno == ECONNRESET);
}